

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

void __thiscall masc::polygon::c_polygon::destroy(c_polygon *this)

{
  bool bVar1;
  pointer this_00;
  _Self local_20;
  _Self local_18;
  iterator i;
  c_polygon *this_local;
  
  i._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::begin
                 ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)this);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::end
                   ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)this);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = std::_List_iterator<masc::polygon::c_ply>::operator->(&local_18);
    c_ply::destroy(this_00);
    std::_List_iterator<masc::polygon::c_ply>::operator++(&local_18,0);
  }
  std::__cxx11::list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::clear
            ((list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)this);
  std::vector<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>::clear
            (&this->all);
  return;
}

Assistant:

void c_polygon::destroy()
{
    for(iterator i=begin();i!=end();i++){
        i->destroy();
    }
    clear(); //remove all ply from this list
    all.clear();
}